

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeMonth(time_t Start,time_t Timezone,time_t RelMonth)

{
  tm *Month_00;
  long lVar1;
  long in_RDX;
  time_t in_RDI;
  time_t Year;
  time_t Month;
  tm *tm;
  undefined4 in_stack_ffffffffffffffb4;
  time_t in_stack_ffffffffffffffb8;
  DSTMODE in_stack_fffffffffffffff8;
  time_t tVar2;
  
  if (in_RDX == 0) {
    tVar2 = 0;
  }
  else {
    Month_00 = localtime((time_t *)&stack0xfffffffffffffff0);
    lVar1 = ((Month_00->tm_year + 0x76c) * 0xc + Month_00->tm_mon) + in_RDX;
    Convert((time_t)Month_00,lVar1 % 0xc + 1,lVar1 / 0xc,in_RDI,in_stack_ffffffffffffffb8,
            CONCAT44(in_stack_ffffffffffffffb4,2),in_RDI,in_stack_fffffffffffffff8);
    tVar2 = DSTcorrect(in_RDI,in_stack_ffffffffffffffb8);
  }
  return tVar2;
}

Assistant:

static time_t
RelativeMonth(time_t Start, time_t Timezone, time_t RelMonth)
{
	struct tm	*tm;
	time_t	Month;
	time_t	Year;

	if (RelMonth == 0)
		return 0;
	tm = localtime(&Start);
	Month = 12 * (tm->tm_year + 1900) + tm->tm_mon + RelMonth;
	Year = Month / 12;
	Month = Month % 12 + 1;
	return DSTcorrect(Start,
	    Convert(Month, (time_t)tm->tm_mday, Year,
		(time_t)tm->tm_hour, (time_t)tm->tm_min, (time_t)tm->tm_sec,
		Timezone, DSTmaybe));
}